

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O2

void do_x25519(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  mg *pmVar5;
  limb_t *plVar6;
  int iVar7;
  byte bVar8;
  ulong local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  ulong uStack_2d0;
  mg res;
  fld_t subA;
  fld_t sumA;
  limb_t local_218 [5];
  limb_t local_1f0 [5];
  mg P;
  fld_t T3;
  fld_t T2;
  fld_t T1;
  fld_t subB;
  fld_t sumB;
  fld_t sqsubA;
  fld_t sqsumA;
  
  bVar8 = 0;
  uStack_2e0 = *(undefined8 *)(scalar + 8);
  local_2d8 = *(undefined8 *)(scalar + 0x10);
  local_2e8 = *(ulong *)scalar & 0xfffffffffffffff8;
  uStack_2d0 = *(ulong *)(scalar + 0x18) & 0x3fffffffffffffff | 0x4000000000000000;
  fld_import(P.x,point);
  fld_set0(P.z,1);
  fld_set0(res.x,1);
  fld_set0(res.z,0);
  pmVar5 = &P;
  plVar6 = local_218;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = pmVar5->x[0];
    pmVar5 = (mg *)((long)pmVar5 + (ulong)bVar8 * -0x10 + 8);
    plVar6 = plVar6 + (ulong)bVar8 * -2 + 1;
  }
  uVar4 = 0;
  for (uVar2 = 0x1f; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    cVar1 = *(char *)((long)&local_2e8 + (ulong)uVar2);
    for (iVar7 = -8; iVar7 != 0; iVar7 = iVar7 + 1) {
      ctmemswap(&res,local_218,(ulong)(byte)(cVar1 >> 7),(uint8_t)uVar4);
      plVar6 = res.z;
      fld_add(sumA,res.x,plVar6);
      fld_sq(sqsumA,sumA);
      fld_sub(subA,res.x,plVar6);
      fld_sq(sqsubA,subA);
      fld_mul(res.x,sqsubA,sqsumA);
      fld_sub(T1,sqsumA,sqsubA);
      fld_scale(T2,T1,0x1db41);
      fld_add(T2,T2,sqsumA);
      fld_mul(plVar6,T1,T2);
      fld_add(sumB,local_218,local_1f0);
      fld_sub(subB,local_218,local_1f0);
      fld_mul(T1,subA,sumB);
      fld_mul(T2,sumA,subB);
      fld_add(T3,T1,T2);
      fld_sq(local_218,T3);
      fld_sub(T3,T1,T2);
      fld_sq(T3,T3);
      fld_mul(local_1f0,T3,P.x);
      ctmemswap(&res,local_218,(ulong)(byte)(cVar1 >> 7),(uint8_t)uVar4);
      cVar1 = cVar1 * '\x02';
    }
  }
  plVar6 = res.z;
  fld_inv(plVar6,plVar6);
  fld_mul(res.x,res.x,plVar6);
  fld_export(out,res.x);
  return;
}

Assistant:

static void
do_x25519(uint8_t out[X25519_KEY_LEN],
	     const uint8_t scalar[X25519_KEY_LEN],
	     const uint8_t point[X25519_KEY_LEN])
{
	struct mg res, P;
	uint8_t s[X25519_KEY_LEN];

	memcpy(s, scalar, X25519_KEY_LEN);
	s[0] &= 0xf8;
	s[31] &= 0x7f;
	s[31] |= 0x40;
 	
	fld_import(P.x, point);
	fld_set0(P.z, 1);
	
	mg_scale(&res, &P, s);

	fld_inv(res.z, res.z);
	fld_mul(res.x, res.x, res.z);
	fld_export(out, res.x);
}